

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_read(lua_State *L,IOFileUD *iof,int start)

{
  FILE *__stream;
  MSize m;
  int iVar1;
  ulong uVar2;
  byte *local_48;
  char *p;
  int local_38;
  int nargs;
  int n;
  int ok;
  FILE *fp;
  int start_local;
  IOFileUD *iof_local;
  lua_State *L_local;
  
  __stream = (FILE *)iof->fp;
  p._4_4_ = (int)((long)L->top - (long)L->base >> 3) - start;
  clearerr(__stream);
  if (p._4_4_ == 0) {
    nargs = io_file_readline(L,(FILE *)__stream,1);
    local_38 = start + 1;
  }
  else {
    luaL_checkstack(L,p._4_4_ + 0x14,"too many arguments");
    nargs = 1;
    local_38 = start;
    while (p._4_4_ != 0 && nargs != 0) {
      if ((int)L->base[local_38].field_4.it >> 0xf == -5) {
        uVar2 = L->base[local_38].u64 & 0x7fffffffffff;
        local_48 = (byte *)(uVar2 + 0x18);
        if (*local_48 == 0x2a) {
          local_48 = (byte *)(uVar2 + 0x19);
        }
        if (*local_48 == 0x6e) {
          nargs = io_file_readnum(L,(FILE *)__stream);
        }
        else if ((*local_48 & 0xdf) == 0x4c) {
          nargs = io_file_readline(L,(FILE *)__stream,(uint)(*local_48 == 0x6c));
        }
        else {
          if (*local_48 != 0x61) {
            lj_err_arg(L,local_38 + 1,LJ_ERR_INVFMT);
          }
          io_file_readall(L,(FILE *)__stream);
        }
      }
      else {
        if (0xfffffff2 < (uint)((int)L->base[local_38].field_4.it >> 0xf)) {
          lj_err_arg(L,local_38 + 1,LJ_ERR_INVOPT);
        }
        m = lj_lib_checkint(L,local_38 + 1);
        nargs = io_file_readlen(L,(FILE *)__stream,m);
      }
      local_38 = local_38 + 1;
      p._4_4_ = p._4_4_ + -1;
    }
  }
  iVar1 = ferror(__stream);
  if (iVar1 == 0) {
    if (nargs == 0) {
      L->top[-1].u64 = 0xffffffffffffffff;
    }
    L_local._4_4_ = local_38 - start;
  }
  else {
    L_local._4_4_ = luaL_fileresult(L,0,(char *)0x0);
  }
  return L_local._4_4_;
}

Assistant:

static int io_file_read(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] == '*') p++;
	if (p[0] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[0] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[0] == 'l'));
	else if (p[0] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}